

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aln_filter.cpp
# Opt level: O2

int main(void)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  uint uVar4;
  aln_t *paVar5;
  ostream *poVar6;
  initializer_list<long> __l;
  vector<example::aln_t,_std::allocator<example::aln_t>_> local_2bd8;
  _Elt_pointer local_2bc0;
  _Vector_base<long,_std::allocator<long>_> local_2bb8;
  code *local_2ba0;
  undefined8 local_2b98;
  _Elt_pointer local_2b90;
  undefined1 local_2b88 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b68;
  undefined8 local_2b58;
  undefined1 auStack_2b50 [64];
  undefined1 local_2b10 [8];
  undefined1 local_2b08 [8];
  undefined1 local_2b00 [168];
  anon_class_8_1_3fcf6586_conflict local_2a58;
  iterator iStack_2a50;
  undefined1 local_2a48 [16];
  iterator iStack_2a38;
  iterator local_2a30;
  pointer paStack_2a28;
  pointer local_2a20;
  anon_class_8_1_3fcf6586_conflict aStack_2a18;
  iterator local_2a10;
  anon_union_16_2_edcbc2ec_for_maybe<std::future<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>_>_1
  aStack_2a08;
  _Map_pointer ppfStack_29f8;
  _Elt_pointer local_29f0;
  _Elt_pointer pfStack_29e8;
  _Elt_pointer local_29e0;
  _Elt_pointer pfStack_29d8;
  iterator local_29d0;
  iterator iStack_29c8;
  _Elt_pointer local_29c0;
  _Elt_pointer pfStack_29b8;
  _Elt_pointer local_29b0;
  bool local_2988;
  anon_union_24_2_edcbc2ec_for_maybe<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>_1
  local_2980;
  bool local_2960;
  undefined1 uStack_295f;
  bool local_295e;
  anon_union_24_2_edcbc2ec_for_maybe<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_1
  local_2958 [4];
  undefined1 local_28f0 [42];
  bool local_28c6;
  anon_union_24_2_edcbc2ec_for_maybe<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_1
  local_2880;
  bool local_2858;
  bool bStack_2857;
  bool local_2856;
  bool local_27e8;
  bool bStack_27e7;
  bool local_27e6;
  undefined1 local_27d8 [32];
  anon_union_16_2_edcbc2ec_for_maybe<std::future<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>_>_1
  local_27b8 [2];
  undefined1 local_2798;
  undefined7 uStack_2797;
  anon_union_16_2_edcbc2ec_for_maybe<std::future<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>_>_1
  aStack_2790;
  undefined8 local_2780;
  anon_union_24_2_edcbc2ec_for_maybe<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_1
  local_2778 [2];
  pointer local_2748;
  undefined8 local_2738;
  undefined8 uStack_2730;
  pointer local_2728;
  iterator iStack_2720;
  anon_union_24_2_edcbc2ec_for_maybe<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_1
  local_2718 [13];
  anon_union_24_2_edcbc2ec_for_maybe<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>_1
  local_25d0;
  undefined2 local_25b0;
  bool local_25ae;
  anon_union_24_2_edcbc2ec_for_maybe<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_1
  local_25a8;
  pointer local_2590;
  iterator iStack_2588;
  _Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>
  local_2580;
  pointer paStack_2578;
  pointer local_2570;
  pointer paStack_2568;
  anon_union_24_2_edcbc2ec_for_maybe<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_1
  local_2538;
  pointer local_2520;
  iterator iStack_2518;
  _Mem_fn<int_example::aln_t::*> local_2510;
  pointer paStack_2508;
  pointer local_2500;
  pointer paStack_24f8;
  code *local_24f0;
  bool local_24c8;
  bool bStack_24c7;
  bool local_24c6;
  seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>
  local_24c0;
  seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>
  local_2488;
  maybe<example::aln_t> x;
  gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
  local_23c8;
  undefined2 local_2120;
  bool local_211e;
  seq<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>
  local_2118;
  undefined1 local_2098 [56];
  _Alloc_hider _Stack_2060;
  pointer local_2050;
  pointer paStack_2048;
  _Alloc_hider local_2040;
  pointer local_2038;
  pointer paStack_2030;
  pointer local_2028;
  undefined2 local_2018;
  bool local_2016;
  undefined1 local_2010 [488];
  anon_union_128_2_edcbc2ec_for_maybe<example::aln_t>_1 local_1e28;
  undefined1 local_1da8;
  gen<rangeless::fn::impl::transform<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_(*)(std::vector<example::aln_t,_std::allocator<example::aln_t>_>)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
  local_1da0;
  undefined2 local_1a88;
  undefined1 local_1a86;
  seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>
  local_1a80;
  seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>
  local_19d8;
  undefined1 local_1930 [240];
  undefined2 local_1840;
  bool local_183e;
  seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>
  local_1838;
  seq<rangeless::fn::impl::transform<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_(*)(std::vector<example::aln_t,_std::allocator<example::aln_t>_>)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
  local_1740;
  seq<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>
  local_1428;
  seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>
  local_1330;
  seq<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>
  local_1120;
  undefined1 local_fb8 [272];
  undefined2 local_ea8;
  bool local_ea6;
  seq<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>
  local_ea0;
  seq<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>
  local_d88;
  seq<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>
  local_b50;
  seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
  local_8b0;
  seq<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>
  local_608;
  seq<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
  local_340;
  
  local_2bd8.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2bd8.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2bd8.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b88._0_8_ = 0x65;
  local_2b88._8_4_ = 2;
  local_1e28.m_value.aln_id._0_4_ = 2;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[10],_int,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)(local_2b88 + 0x10),(char (*) [10])"NM_000001",(int *)&local_1e28);
  x.field_0.m_value.aln_id._0_4_ = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[10],_int,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)auStack_2b50,(char (*) [10])"NC_000001",(int *)&x);
  auStack_2b50._40_8_ = 1000000;
  auStack_2b50._48_8_ = 0xf4628;
  auStack_2b50._56_8_ = 0x18704;
  local_2b10 = (undefined1  [8])0x64;
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::emplace_back<example::aln_t>
            (&local_2bd8,(aln_t *)local_2b88);
  example::aln_t::~aln_t((aln_t *)local_2b88);
  local_2b88._0_8_ = 0x66;
  local_2b88._8_4_ = 2;
  local_1e28.m_value.aln_id._0_4_ = 2;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[10],_int,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)(local_2b88 + 0x10),(char (*) [10])"NM_000001",(int *)&local_1e28);
  x.field_0.m_value.aln_id._0_4_ = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[10],_int,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)auStack_2b50,(char (*) [10])"NC_000001",(int *)&x);
  auStack_2b50._40_8_ = 1000000;
  auStack_2b50._48_8_ = 0xf4628;
  auStack_2b50._56_8_ = 0x18704;
  local_2b10 = (undefined1  [8])0x64;
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::emplace_back<example::aln_t>
            (&local_2bd8,(aln_t *)local_2b88);
  example::aln_t::~aln_t((aln_t *)local_2b88);
  local_2b88._0_8_ = 0x67;
  local_2b88._8_4_ = 2;
  local_1e28.m_value.aln_id._0_4_ = 2;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[10],_int,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)(local_2b88 + 0x10),(char (*) [10])"NM_000001",(int *)&local_1e28);
  x.field_0.m_value.aln_id._0_4_ = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[10],_int,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)auStack_2b50,(char (*) [10])"NC_000001",(int *)&x);
  auStack_2b50._40_8_ = 0xf4241;
  auStack_2b50._48_8_ = 0xf4628;
  auStack_2b50._56_8_ = 0x18704;
  local_2b10 = (undefined1  [8])0x32;
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::emplace_back<example::aln_t>
            (&local_2bd8,(aln_t *)local_2b88);
  example::aln_t::~aln_t((aln_t *)local_2b88);
  local_2b88._0_8_ = 0x68;
  local_2b88._8_4_ = 2;
  local_1e28.m_value.aln_id._0_4_ = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[10],_int,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)(local_2b88 + 0x10),(char (*) [10])"NM_000001",(int *)&local_1e28);
  x.field_0.m_value.aln_id._0_4_ = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[10],_int,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)auStack_2b50,(char (*) [10])"NC_000001",(int *)&x);
  auStack_2b50._40_8_ = 1000000;
  auStack_2b50._48_8_ = 0xf4628;
  auStack_2b50._56_8_ = 0x18704;
  local_2b10 = (undefined1  [8])0x64;
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::emplace_back<example::aln_t>
            (&local_2bd8,(aln_t *)local_2b88);
  example::aln_t::~aln_t((aln_t *)local_2b88);
  local_2b88._0_8_ = 0xc9;
  local_2b88._8_4_ = 2;
  local_1e28.m_value.aln_id._0_4_ = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[10],_int,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)(local_2b88 + 0x10),(char (*) [10])"NM_000002",(int *)&local_1e28);
  x.field_0.m_value.aln_id._0_4_ = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[10],_int,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)auStack_2b50,(char (*) [10])"NC_000001",(int *)&x);
  auStack_2b50._40_8_ = 1000000;
  auStack_2b50._48_8_ = 0xf4628;
  auStack_2b50._56_8_ = 0;
  local_2b10 = (undefined1  [8])0x64;
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::emplace_back<example::aln_t>
            (&local_2bd8,(aln_t *)local_2b88);
  example::aln_t::~aln_t((aln_t *)local_2b88);
  local_2b88._0_8_ = 0x12d;
  local_2b88._8_4_ = 2;
  local_1e28.m_value.aln_id._0_4_ = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[10],_int,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)(local_2b88 + 0x10),(char (*) [10])"NM_000003",(int *)&local_1e28);
  x.field_0.m_value.aln_id._0_4_ = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[10],_int,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)auStack_2b50,(char (*) [10])"NC_000001",(int *)&x);
  auStack_2b50._40_8_ = 1000000;
  auStack_2b50._48_8_ = 0xf4628;
  auStack_2b50._56_8_ = 0;
  local_2b10 = (undefined1  [8])0x64;
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::emplace_back<example::aln_t>
            (&local_2bd8,(aln_t *)local_2b88);
  example::aln_t::~aln_t((aln_t *)local_2b88);
  local_2b88._0_8_ = 0x191;
  local_2b88._8_4_ = 2;
  local_1e28.m_value.aln_id._0_4_ = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[10],_int,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)(local_2b88 + 0x10),(char (*) [10])"NM_000004",(int *)&local_1e28);
  x.field_0.m_value.aln_id._0_4_ = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[10],_int,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)auStack_2b50,(char (*) [10])"NC_000001",(int *)&x);
  auStack_2b50._40_8_ = 1000000;
  auStack_2b50._48_8_ = 0xf4628;
  auStack_2b50._56_8_ = 0;
  local_2b10 = (undefined1  [8])0x64;
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::emplace_back<example::aln_t>
            (&local_2bd8,(aln_t *)local_2b88);
  example::aln_t::~aln_t((aln_t *)local_2b88);
  local_2b88._0_8_ = 0x1f5;
  local_2b88._8_4_ = 2;
  local_1e28.m_value.aln_id._0_4_ = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[10],_int,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)(local_2b88 + 0x10),(char (*) [10])"NM_000005",(int *)&local_1e28);
  x.field_0.m_value.aln_id._0_4_ = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[10],_int,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)auStack_2b50,(char (*) [10])"NC_000001",(int *)&x);
  auStack_2b50._40_8_ = 1000000;
  auStack_2b50._48_8_ = 0xf4628;
  auStack_2b50._56_8_ = 0x18704;
  local_2b10 = (undefined1  [8])0x6e;
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::emplace_back<example::aln_t>
            (&local_2bd8,(aln_t *)local_2b88);
  example::aln_t::~aln_t((aln_t *)local_2b88);
  local_2b88._0_8_ = 0x321;
  local_2b88._8_4_ = 2;
  local_1e28.m_value.aln_id._0_4_ = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[10],_int,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)(local_2b88 + 0x10),(char (*) [10])"NM_000008",(int *)&local_1e28);
  x.field_0.m_value.aln_id._0_4_ = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[10],_int,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)auStack_2b50,(char (*) [10])"NC_000001",(int *)&x);
  auStack_2b50._40_8_ = 1000000;
  auStack_2b50._48_8_ = 0xf4628;
  auStack_2b50._56_8_ = 0x18768;
  local_2b10 = (undefined1  [8])0x64;
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::emplace_back<example::aln_t>
            (&local_2bd8,(aln_t *)local_2b88);
  example::aln_t::~aln_t((aln_t *)local_2b88);
  local_2b88._0_8_ = 0x259;
  local_2b88._8_4_ = 3;
  local_1e28.m_value.aln_id._0_4_ = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[10],_int,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)(local_2b88 + 0x10),(char (*) [10])"NM_000005",(int *)&local_1e28);
  x.field_0.m_value.aln_id._0_4_ = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[10],_int,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)auStack_2b50,(char (*) [10])"NC_000001",(int *)&x);
  auStack_2b50._40_8_ = 1000000;
  auStack_2b50._48_8_ = 0xf4628;
  auStack_2b50._56_8_ = 0x18704;
  local_2b10 = (undefined1  [8])0x64;
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::emplace_back<example::aln_t>
            (&local_2bd8,(aln_t *)local_2b88);
  example::aln_t::~aln_t((aln_t *)local_2b88);
  local_2b88._0_8_ = 0x2bd;
  local_2b88._8_4_ = 3;
  local_1e28.m_value.aln_id._0_4_ = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[10],_int,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)(local_2b88 + 0x10),(char (*) [10])"NM_000007",(int *)&local_1e28);
  x.field_0.m_value.aln_id._0_4_ = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[10],_int,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)auStack_2b50,(char (*) [10])"NT_000001",(int *)&x);
  auStack_2b50._40_8_ = 1000000;
  auStack_2b50._48_8_ = 0xf4628;
  auStack_2b50._56_8_ = 0x18704;
  local_2b10 = (undefined1  [8])0x64;
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::emplace_back<example::aln_t>
            (&local_2bd8,(aln_t *)local_2b88);
  example::aln_t::~aln_t((aln_t *)local_2b88);
  local_2bb8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a80.m_current.m_empty = true;
  local_1a80.m_gen.gen.i = 0;
  local_2bb8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2bb8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a80.m_gen.ended = false;
  local_1a80.m_started = false;
  local_1a80.m_ended = false;
  local_1a80.m_resumable = false;
  local_1a80.m_gen.gen.alns = &local_2bd8;
  rangeless::fn::impl::
  seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>
  ::seq(&local_19d8,&local_1a80);
  rangeless::fn::impl::
  seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>
  ::seq((seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>
         *)local_2b88,&local_19d8);
  uVar1 = local_27d8._16_8_;
  local_27d8[0x10] = local_2b00[0x10];
  uVar2 = local_27d8._16_8_;
  local_27d8._0_8_ = local_2b00._0_8_;
  local_27d8._8_8_ = local_2b00._8_8_;
  local_27d8._24_8_ = 8;
  local_2118.m_current.m_empty = true;
  local_2118.m_gen.gen.gen.i = local_2b00._0_8_;
  local_2118.m_gen.gen.gen.alns = (alns_t *)local_2b00._8_8_;
  local_2118.m_gen.gen.ended = (bool)local_2b00[0x10];
  local_27d8._17_4_ = SUB84(uVar1,1);
  local_2118.m_gen.gen._17_4_ = local_27d8._17_4_;
  local_27d8._21_2_ = SUB82(uVar1,5);
  local_2118.m_gen.gen._21_2_ = local_27d8._21_2_;
  local_27d8[0x17] = SUB81(uVar1,7);
  local_2118.m_gen.gen._23_1_ = local_27d8[0x17];
  local_2118.m_gen.key_fn.super__Mem_fn_base<int_example::aln_t::*,_false>._M_pm =
       (_Mem_fn_base<int_example::aln_t::*,_false>)8;
  local_2118.m_gen.next.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2118.m_gen.next.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2118.m_gen.next.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_27b8[0].m_value.
  super___basic_future<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>
  ._M_state.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_27b8[1]._0_8_ = (pointer)0x0;
  local_27b8[1]._8_8_ = (pointer)0x0;
  local_2118.m_gen.garbage.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2118.m_gen.garbage.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2118.m_gen.garbage.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _local_2798 = (pointer)0x0;
  aStack_2790.m_value.
  super___basic_future<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>
  ._M_state.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  aStack_2790.m_value.
  super___basic_future<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>
  ._M_state.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (__shared_count<(__gnu_cxx::_Lock_policy)2>)
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_2118.m_started = false;
  local_2118.m_ended = false;
  local_2118.m_resumable = false;
  local_27d8._16_8_ = uVar2;
  rangeless::fn::impl::
  group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::
  gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>
  ::~gen((gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>
          *)local_27d8);
  rangeless::fn::impl::maybe<example::aln_t>::reset((maybe<example::aln_t> *)local_2b88);
  rangeless::fn::impl::maybe<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>::maybe
            ((maybe<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_> *)local_2b88,
             &local_2118.m_current);
  local_2028 = local_2118.m_gen.garbage.
               super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
  paStack_2030 = local_2118.m_gen.garbage.
                 super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
                 super__Vector_impl_data._M_finish;
  local_2038 = local_2118.m_gen.garbage.
               super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
               super__Vector_impl_data._M_start;
  local_2040._M_p =
       (pointer)local_2118.m_gen.next.
                super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  paStack_2048 = local_2118.m_gen.next.
                 super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
                 super__Vector_impl_data._M_finish;
  local_2050 = local_2118.m_gen.next.
               super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
               super__Vector_impl_data._M_start;
  local_2b58._1_4_ = local_2118.m_gen.gen._17_4_;
  local_2b58._0_1_ = local_2118.m_gen.gen.ended;
  local_2b58._5_2_ = local_2118.m_gen.gen._21_2_;
  local_2b58._7_1_ = local_2118.m_gen.gen._23_1_;
  auStack_2b50._0_8_ =
       local_2118.m_gen.key_fn.super__Mem_fn_base<int_example::aln_t::*,_false>._M_pm;
  local_2b68._M_allocated_capacity = local_2118.m_gen.gen.gen.i;
  local_2b68._8_8_ = local_2118.m_gen.gen.gen.alns;
  local_2118.m_gen.next.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2118.m_gen.next.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2118.m_gen.next.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2118.m_gen.garbage.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2118.m_gen.garbage.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2118.m_gen.garbage.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b10[2] = local_2118.m_resumable;
  local_2b10[0] = local_2118.m_started;
  local_2b10[1] = local_2118.m_ended;
  local_27d8._24_8_ = local_2118.m_gen.key_fn.super__Mem_fn_base<int_example::aln_t::*,_false>._M_pm
  ;
  local_27d8._0_8_ = local_2118.m_gen.gen.gen.i;
  local_27d8._8_8_ = local_2118.m_gen.gen.gen.alns;
  auStack_2b50._48_8_ = 0;
  auStack_2b50._56_8_ = 0;
  auStack_2b50._32_8_ = 0;
  auStack_2b50._40_8_ = 0;
  auStack_2b50._16_8_ = 0;
  auStack_2b50._24_8_ = 0;
  local_2098[0x18] = true;
  local_2098._48_8_ =
       CONCAT17(local_2118.m_gen.gen._23_1_,
                CONCAT25(local_2118.m_gen.gen._21_2_,
                         CONCAT41(local_2118.m_gen.gen._17_4_,local_2118.m_gen.gen.ended)));
  _Stack_2060._M_p =
       (pointer)local_2118.m_gen.key_fn.super__Mem_fn_base<int_example::aln_t::*,_false>._M_pm;
  local_2098._32_8_ = local_2118.m_gen.gen.gen.i;
  local_2098._40_8_ = local_2118.m_gen.gen.gen.alns;
  local_27b8[1]._8_8_ = (pointer)0x0;
  local_27b8[0].m_value.
  super___basic_future<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>
  ._M_state.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_27b8[1]._0_8_ = (pointer)0x0;
  _local_2798 = (pointer)0x0;
  aStack_2790.m_value.
  super___basic_future<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>
  ._M_state.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  aStack_2790.m_value.
  super___basic_future<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>
  ._M_state.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (__shared_count<(__gnu_cxx::_Lock_policy)2>)
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_2018 = 0;
  local_2016 = false;
  local_27d8._16_8_ = local_2b58;
  rangeless::fn::impl::
  group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::
  gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>
  ::~gen((gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>
          *)local_27d8);
  rangeless::fn::impl::
  seq<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>
  ::~seq((seq<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>
          *)local_2b88);
  rangeless::fn::impl::maybe<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>::maybe
            ((maybe<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_> *)local_27d8,
             (maybe<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_> *)local_2098);
  auStack_2b50._24_8_ = local_2028;
  auStack_2b50._16_8_ = paStack_2030;
  auStack_2b50._8_8_ = local_2038;
  auStack_2b50._0_8_ = local_2040._M_p;
  local_2b58 = paStack_2048;
  local_2b68._8_8_ = local_2050;
  local_27b8[1]._0_8_ = local_2098._48_8_;
  local_27b8[1]._8_8_ = _Stack_2060._M_p;
  local_27b8[0].m_value.
  super___basic_future<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>
  ._M_state.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = local_2098._32_8_;
  local_27b8[0].m_value.
  super___basic_future<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>
  ._M_state.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_2098._40_8_;
  local_2050 = (pointer)0x0;
  paStack_2048 = (pointer)0x0;
  local_2040._M_p = (pointer)0x0;
  local_2028 = (pointer)0x0;
  local_2038 = (pointer)0x0;
  paStack_2030 = (pointer)0x0;
  local_2778[1]._8_2_ = local_2018;
  local_2778[1]._10_1_ = local_2016;
  local_2b88._16_8_ = local_2098._48_8_;
  local_2b88._24_8_ = _Stack_2060._M_p;
  local_2b88._0_8_ = local_2098._32_8_;
  local_2b88._8_8_ = local_2098._40_8_;
  local_2780 = (pointer)0x0;
  aStack_2790.m_value.
  super___basic_future<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>
  ._M_state.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  aStack_2790.m_value.
  super___basic_future<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>
  ._M_state.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (__shared_count<(__gnu_cxx::_Lock_policy)2>)
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_2778[0].m_value.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2778[0].m_value.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2778[0].m_value.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2b10[0] = 1;
  local_2b08 = (undefined1  [8])0x0;
  local_fb8[0x80] = true;
  rangeless::fn::impl::concat::
  gen<rangeless::fn::impl::transform<example::$_7::TEMPNAMEPLACEHOLDERVALUE(rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<main::$_0>>)const::{lambda(std::vector<example::aln_t,std::allocator<example::aln_t>>)#1}>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<main::$_0>>>>
  ::operator()((gen<rangeless::fn::impl::transform<example::__7::TEMPNAMEPLACEHOLDERVALUE(rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<main::__0>>)const::_lambda(std::vector<example::aln_t,std::allocator<example::aln_t>>)_1_>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<main::__0>>>>
                *)(local_fb8 + 0x88),
               (gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>
                *)local_2b88);
  local_ea8._0_1_ = false;
  local_ea8._1_1_ = false;
  local_ea6 = false;
  rangeless::fn::impl::concat::
  gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>
  ::~gen((gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>
          *)local_2b88);
  rangeless::fn::impl::
  seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>
  ::~seq((seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>
          *)local_27d8);
  uVar4 = std::thread::hardware_concurrency();
  local_2bc0 = (_Elt_pointer)(ulong)uVar4;
  local_2ba0 = example::realign;
  local_2b98 = 2;
  local_2b90 = local_2bc0;
  rangeless::fn::impl::
  seq<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<example::$_7::TEMPNAMEPLACEHOLDERVALUE(rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<main::$_0>>)const::{lambda(std::vector<example::aln_t,std::allocator<example::aln_t>>)#1}>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<main::$_0>>>>>
  ::operator()((seq<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<example::__7::TEMPNAMEPLACEHOLDERVALUE(rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<main::__0>>)const::_lambda(std::vector<example::aln_t,std::allocator<example::aln_t>>)_1_>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<main::__0>>>>>
                *)&local_ea0,
               (seq<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>
                *)local_fb8);
  rangeless::fn::impl::
  seq<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<example::$_7::TEMPNAMEPLACEHOLDERVALUE(rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<main::$_0>>)const::{lambda(std::vector<example::aln_t,std::allocator<example::aln_t>>)#1}>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<main::$_0>>>>>
  ::operator()((seq<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<example::__7::TEMPNAMEPLACEHOLDERVALUE(rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<main::__0>>)const::_lambda(std::vector<example::aln_t,std::allocator<example::aln_t>>)_1_>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<main::__0>>>>>
                *)local_2b88,&local_ea0);
  rangeless::fn::impl::concat::
  gen<rangeless::fn::impl::transform<example::$_7::TEMPNAMEPLACEHOLDERVALUE(rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<main::$_0>>)const::{lambda(std::vector<example::aln_t,std::allocator<example::aln_t>>)#1}>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<main::$_0>>>>
  ::operator()((gen<rangeless::fn::impl::transform<example::__7::TEMPNAMEPLACEHOLDERVALUE(rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<main::__0>>)const::_lambda(std::vector<example::aln_t,std::allocator<example::aln_t>>)_1_>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<main::__0>>>>
                *)local_27d8,
               (gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>
                *)local_2b00);
  local_2778[1].m_value.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x2;
  local_2748 = (pointer)0x0;
  local_2738 = (pointer)0x0;
  uStack_2730 = (pointer)0x0;
  local_2728 = (pointer)0x0;
  iStack_2720._M_current = (pointer)0x0;
  local_2718[0].m_value.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2718[0].m_value.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1930[0x18] = true;
  rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,rangeless::fn::impl::eq>::
  gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<example::$_7::TEMPNAMEPLACEHOLDERVALUE(rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<main::$_0>>)const::{lambda(std::vector<example::aln_t,std::allocator<example::aln_t>>)#1}>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<main::$_0>>>>>
  ::operator()((gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<example::__7::TEMPNAMEPLACEHOLDERVALUE(rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<main::__0>>)const::_lambda(std::vector<example::aln_t,std::allocator<example::aln_t>>)_1_>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<main::__0>>>>>
                *)(local_1930 + 0x20),
               (gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>
                *)local_27d8);
  local_1840._0_1_ = false;
  local_1840._1_1_ = false;
  local_183e = false;
  rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::
  gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>
  ::~gen((gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>
          *)local_27d8);
  rangeless::fn::impl::
  seq<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>
  ::~seq((seq<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>
          *)local_2b88);
  if (uVar4 == 0) {
    __assert_fail("max_queue_size >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp"
                  ,0xa2,
                  "auto example::my::(anonymous class)::operator()(auto, size_t) const [fn:auto = (lambda at /workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:215:41)]"
                 );
  }
  rangeless::fn::impl::
  seq<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<example::$_7::TEMPNAMEPLACEHOLDERVALUE(rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<main::$_0>>)const::{lambda(std::vector<example::aln_t,std::allocator<example::aln_t>>)#1}>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<main::$_0>>>>>>
  ::operator()((seq<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<example::__7::TEMPNAMEPLACEHOLDERVALUE(rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<main::__0>>)const::_lambda(std::vector<example::aln_t,std::allocator<example::aln_t>>)_1_>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<main::__0>>>>>>
                *)&local_1428,
               (seq<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>
                *)local_1930);
  rangeless::fn::impl::
  seq<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<example::$_7::TEMPNAMEPLACEHOLDERVALUE(rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<main::$_0>>)const::{lambda(std::vector<example::aln_t,std::allocator<example::aln_t>>)#1}>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<main::$_0>>>>>>
  ::operator()((seq<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<example::__7::TEMPNAMEPLACEHOLDERVALUE(rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<main::__0>>)const::_lambda(std::vector<example::aln_t,std::allocator<example::aln_t>>)_1_>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<main::__0>>>>>>
                *)local_2b88,&local_1428);
  rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,rangeless::fn::impl::eq>::
  gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<example::$_7::TEMPNAMEPLACEHOLDERVALUE(rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<main::$_0>>)const::{lambda(std::vector<example::aln_t,std::allocator<example::aln_t>>)#1}>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<main::$_0>>>>>
  ::operator()((gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<example::__7::TEMPNAMEPLACEHOLDERVALUE(rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<main::__0>>)const::_lambda(std::vector<example::aln_t,std::allocator<example::aln_t>>)_1_>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<main::__0>>>>>
                *)local_2010,
               (gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>
                *)&local_2b68);
  local_2010._208_8_ = &local_2ba0;
  local_1838.m_current.m_empty = true;
  rangeless::fn::impl::
  transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>
  ::
  gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>
  ::gen(&local_1838.m_gen,
        (gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>
         *)local_2010);
  local_1838.m_started = false;
  local_1838.m_ended = false;
  local_1838.m_resumable = false;
  rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::
  gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>
  ::~gen((gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>
          *)local_2010);
  rangeless::fn::impl::
  seq<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>
  ::~seq((seq<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>
          *)local_2b88);
  local_24c0.m_current.m_empty = true;
  local_24c0.m_gen.gen.i = 1;
  local_24c0.m_gen.gen.max_queue_size = (size_t)local_2bc0;
  local_24c0.m_gen.ended = false;
  local_24c0.m_started = false;
  local_24c0.m_ended = false;
  local_24c0.m_resumable = false;
  rangeless::fn::impl::
  seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>
  ::seq(&local_2488,&local_24c0);
  rangeless::fn::impl::
  seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>
  ::seq((seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>
         *)local_2010,&local_1838);
  rangeless::fn::impl::
  seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>
  ::seq((seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>
         *)local_2b88,
        (seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>
         *)local_2010);
  rangeless::fn::impl::
  seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>
  ::seq((seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>
         *)(local_2b00 + 0x70),&local_2488);
  local_2a48._0_4_ = 0;
  local_2a58.fn.fn =
       (anon_class_8_1_3fcf6586)
       (_func_vector<example::aln_t,_std::allocator<example::aln_t>_>_aln_t **)0x0;
  iStack_2a50.m_parent =
       (seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>
        *)0x0;
  local_1120.m_current.m_empty = true;
  rangeless::fn::impl::
  append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>
  ::
  gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>
  ::gen(&local_1120.m_gen,
        (gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>
         *)local_2b88);
  local_1120.m_started = false;
  local_1120.m_ended = false;
  local_1120.m_resumable = false;
  rangeless::fn::impl::
  append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>
  ::
  gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>
  ::~gen((gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>
          *)local_2b88);
  rangeless::fn::impl::
  seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>
  ::~seq((seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>
          *)local_2010);
  rangeless::fn::impl::
  maybe<std::future<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>_>
  ::maybe((maybe<std::future<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>_>
           *)local_2010,&local_1120.m_current);
  rangeless::fn::impl::
  append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>
  ::
  gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>
  ::gen((gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>
         *)(local_2010 + 0x18),&local_1120.m_gen);
  local_2010[0x162] = local_1120.m_resumable;
  local_2010[0x160] = local_1120.m_started;
  local_2010[0x161] = local_1120.m_ended;
  rangeless::fn::impl::
  append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>
  ::
  gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>
  ::gen((gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>
         *)local_2b88,
        (gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>
         *)(local_2010 + 0x18));
  aStack_2a08.m_value.
  super___basic_future<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>
  ._M_state.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (__shared_count<(__gnu_cxx::_Lock_policy)2>)
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ppfStack_29f8 = (_Map_pointer)0x0;
  local_2a10.m_parent =
       (seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>
        *)0x0;
  aStack_2a08.m_value.
  super___basic_future<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>
  ._M_state.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_2a20 = (pointer)0x0;
  aStack_2a18.fn.fn =
       (anon_class_8_1_3fcf6586)
       (_func_vector<example::aln_t,_std::allocator<example::aln_t>_>_aln_t **)0x0;
  local_2a30.m_parent =
       (seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>
        *)0x0;
  paStack_2a28 = (pointer)0x0;
  local_2a48._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  iStack_2a38.m_parent =
       (seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>
        *)0x0;
  std::
  _Deque_base<std::future<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>,_std::allocator<std::future<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>_>_>
  ::_Deque_base((_Deque_base<std::future<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>,_std::allocator<std::future<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>_>_>
                 *)(local_2a48 + 8));
  local_29c0 = (_Elt_pointer)0x0;
  pfStack_29b8 = (_Elt_pointer)0x0;
  local_29d0.m_parent =
       (seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>
        *)0x0;
  iStack_29c8.m_parent =
       (seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>
        *)0x0;
  local_29e0 = (_Elt_pointer)0x0;
  pfStack_29d8 = (_Elt_pointer)0x0;
  local_29f0 = (_Elt_pointer)0x0;
  pfStack_29e8 = (_Elt_pointer)0x0;
  local_29b0 = local_2bc0;
  local_2798 = 1;
  rangeless::fn::impl::sliding_window::
  gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>
  ::gen((gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>
         *)&aStack_2790.m_value,
        (gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>
         *)local_2b88);
  local_25b0._0_1_ = false;
  local_25b0._1_1_ = 0;
  local_25ae = false;
  rangeless::fn::impl::sliding_window::
  gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>
  ::~gen((gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>
          *)local_2b88);
  rangeless::fn::impl::
  seq<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>
  ::~seq((seq<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>
          *)local_2010);
  rangeless::fn::impl::
  maybe<rangeless::fn::view<std::_Deque_iterator<std::future<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>,_std::future<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>_&,_std::future<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>_*>_>_>
  ::maybe((maybe<rangeless::fn::view<std::_Deque_iterator<std::future<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>,_std::future<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>_&,_std::future<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>_*>_>_>
           *)local_2b88,
          (maybe<rangeless::fn::view<std::_Deque_iterator<std::future<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>,_std::future<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>_&,_std::future<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>_*>_>_>
           *)local_27d8);
  rangeless::fn::impl::sliding_window::
  gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>
  ::gen((gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>
         *)(auStack_2b50 + 0x10),
        (gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>
         *)&aStack_2790.m_value);
  local_295e = local_25ae;
  local_2960 = local_25b0._0_1_;
  uStack_295f = local_25b0._1_1_;
  rangeless::fn::impl::sliding_window::
  gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>
  ::gen((gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>
         *)local_2010,
        (gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>
         *)(auStack_2b50 + 0x10));
  local_1330.m_current.m_empty = true;
  rangeless::fn::impl::sliding_window::
  gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>
  ::gen(&local_1330.m_gen.gen,
        (gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>
         *)local_2010);
  local_1330.m_started = false;
  local_1330.m_ended = false;
  local_1330.m_resumable = false;
  rangeless::fn::impl::sliding_window::
  gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>
  ::~gen((gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>
          *)local_2010);
  rangeless::fn::impl::
  seq<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>_>
  ::~seq((seq<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>
          *)local_2b88);
  rangeless::fn::impl::
  seq<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>_>
  ::~seq((seq<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>
          *)local_27d8);
  rangeless::fn::impl::
  seq<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>
  ::~seq(&local_1120);
  rangeless::fn::impl::
  maybe<std::future<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>_>
  ::reset(&local_2488.m_current);
  rangeless::fn::impl::
  maybe<std::future<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>_>
  ::reset(&local_24c0.m_current);
  rangeless::fn::impl::
  seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>
  ::~seq(&local_1838);
  rangeless::fn::impl::
  seq<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>
  ::~seq(&local_1428);
  rangeless::fn::impl::
  maybe<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>
  ::maybe((maybe<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>
           *)local_27d8,&local_1330.m_current);
  rangeless::fn::impl::sliding_window::
  gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>
  ::gen((gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>
         *)&local_27b8[0].m_value,&local_1330.m_gen.gen);
  local_25d0._2_1_ = local_1330.m_resumable;
  local_25d0._0_1_ = local_1330.m_started;
  local_25d0._1_1_ = local_1330.m_ended;
  rangeless::fn::impl::sliding_window::
  gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>
  ::gen((gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>
         *)local_2b88,
        (gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>
         *)&local_27b8[0].m_value);
  local_2988 = true;
  local_2980.m_value.
  super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (vector<example::aln_t,_std::allocator<example::aln_t>_> *)0x0;
  local_d88.m_current.m_empty = true;
  rangeless::fn::impl::concat::
  gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>_>_>
  ::gen(&local_d88.m_gen,
        (gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>
         *)local_2b88);
  local_d88.m_started = false;
  local_d88.m_ended = false;
  local_d88.m_resumable = false;
  rangeless::fn::impl::concat::
  gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>_>_>
  ::~gen((gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>
          *)local_2b88);
  rangeless::fn::impl::
  seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>_>_>
  ::~seq((seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>
          *)local_27d8);
  rangeless::fn::impl::
  seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>_>_>
  ::~seq(&local_1330);
  rangeless::fn::impl::
  seq<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>
  ::~seq((seq<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>
          *)local_1930);
  rangeless::fn::impl::
  seq<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>
  ::~seq(&local_ea0);
  rangeless::fn::impl::maybe<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>::maybe
            ((maybe<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_> *)local_27d8,
             &local_d88.m_current);
  rangeless::fn::impl::concat::
  gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>_>_>
  ::gen((gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>
         *)&local_27b8[0].m_value,&local_d88.m_gen);
  local_25a8._2_1_ = local_d88.m_resumable;
  local_25a8._0_1_ = local_d88.m_started;
  local_25a8._1_1_ = local_d88.m_ended;
  rangeless::fn::impl::concat::
  gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>_>_>
  ::gen((gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>
         *)local_2b88,
        (gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>
         *)&local_27b8[0].m_value);
  local_2960 = true;
  local_2958[0].m_value.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_start = (aln_t *)0x0;
  local_608.m_current.m_empty = true;
  rangeless::fn::impl::concat::
  gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>
  ::gen(&local_608.m_gen,
        (gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>
         *)local_2b88);
  local_608.m_started = false;
  local_608.m_ended = false;
  local_608.m_resumable = false;
  rangeless::fn::impl::concat::
  gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>
  ::~gen((gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>
          *)local_2b88);
  rangeless::fn::impl::
  seq<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>
  ::~seq((seq<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>
          *)local_27d8);
  rangeless::fn::impl::maybe<example::aln_t>::maybe
            ((maybe<example::aln_t> *)local_2b88,&local_608.m_current);
  rangeless::fn::impl::concat::
  gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>
  ::gen((gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>
         *)local_2b00,&local_608.m_gen);
  local_28c6 = local_608.m_resumable;
  local_28f0[0x28] = local_608.m_started;
  local_28f0[0x29] = local_608.m_ended;
  rangeless::fn::impl::concat::
  gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>
  ::gen((gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>
         *)local_27d8,
        (gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>
         *)local_2b00);
  local_25a8.m_value.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x10;
  local_2590 = (pointer)0x0;
  iStack_2588._M_current = (pointer)0x0;
  local_2580.
  super__Mem_fn_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*,_false>
  ._M_pm = (_Mem_fn_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*,_false>
            )0;
  paStack_2578 = (pointer)0x0;
  local_2570 = (pointer)0x0;
  paStack_2568 = (pointer)0x0;
  local_b50.m_current.m_empty = true;
  rangeless::fn::impl::
  group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>
  ::
  gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>
  ::gen(&local_b50.m_gen,
        (gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>
         *)local_27d8);
  local_b50.m_started = false;
  local_b50.m_ended = false;
  local_b50.m_resumable = false;
  rangeless::fn::impl::
  group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>
  ::
  gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>
  ::~gen((gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>
          *)local_27d8);
  rangeless::fn::impl::
  seq<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>
  ::~seq((seq<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>
          *)local_2b88);
  rangeless::fn::impl::maybe<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>::maybe
            ((maybe<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_> *)local_2b88,
             &local_b50.m_current);
  rangeless::fn::impl::
  group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>
  ::
  gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>
  ::gen((gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>
         *)&local_2b68,&local_b50.m_gen);
  local_28f0[2] = local_b50.m_resumable;
  local_28f0[0] = local_b50.m_started;
  local_28f0[1] = local_b50.m_ended;
  rangeless::fn::impl::
  group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>
  ::
  gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>
  ::gen((gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>
         *)local_27d8,
        (gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>
         *)&local_2b68);
  local_8b0.m_current.m_empty = true;
  rangeless::fn::impl::
  group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>
  ::
  gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>
  ::gen(&local_8b0.m_gen.gen,
        (gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>
         *)local_27d8);
  local_8b0.m_started = false;
  local_8b0.m_ended = false;
  local_8b0.m_resumable = false;
  rangeless::fn::impl::
  group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>
  ::
  gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>
  ::~gen((gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>
          *)local_27d8);
  rangeless::fn::impl::
  seq<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>
  ::~seq((seq<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>
          *)local_2b88);
  rangeless::fn::impl::maybe<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>::maybe
            ((maybe<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_> *)local_27d8,
             &local_8b0.m_current);
  rangeless::fn::impl::
  group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>
  ::
  gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>
  ::gen((gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>
         *)&local_27b8[0].m_value,&local_8b0.m_gen.gen);
  local_2538._2_1_ = local_8b0.m_resumable;
  local_2538._0_1_ = local_8b0.m_started;
  local_2538._1_1_ = local_8b0.m_ended;
  rangeless::fn::impl::
  group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>
  ::
  gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>
  ::gen((gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>
         *)local_2b88,
        (gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>
         *)&local_27b8[0].m_value);
  local_28f0[0] = 1;
  local_28f0._8_8_ = (pointer)0x0;
  x.m_empty = true;
  rangeless::fn::impl::concat::
  gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
  ::gen(&local_23c8,
        (gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
         *)local_2b88);
  local_2120._0_1_ = false;
  local_2120._1_1_ = false;
  local_211e = false;
  rangeless::fn::impl::concat::
  gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
  ::~gen((gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
          *)local_2b88);
  rangeless::fn::impl::
  seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
  ::~seq((seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
          *)local_27d8);
  rangeless::fn::impl::maybe<example::aln_t>::maybe((maybe<example::aln_t> *)local_2b88,&x);
  rangeless::fn::impl::concat::
  gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
  ::gen((gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
         *)local_2b00,&local_23c8);
  local_2856 = local_211e;
  local_2858 = local_2120._0_1_;
  bStack_2857 = local_2120._1_1_;
  rangeless::fn::impl::concat::
  gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
  ::gen((gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
         *)local_27d8,
        (gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
         *)local_2b00);
  local_2538.m_value.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x8;
  local_2520 = (pointer)0x0;
  iStack_2518._M_current = (pointer)0x0;
  local_2510.super__Mem_fn_base<int_example::aln_t::*,_false>._M_pm =
       (_Mem_fn_base<int_example::aln_t::*,_false>)0;
  paStack_2508 = (pointer)0x0;
  local_2500 = (pointer)0x0;
  paStack_24f8 = (pointer)0x0;
  local_340.m_current.m_empty = true;
  rangeless::fn::impl::
  group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::
  gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
  ::gen(&local_340.m_gen,
        (gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
         *)local_27d8);
  local_340.m_started = false;
  local_340.m_ended = false;
  local_340.m_resumable = false;
  rangeless::fn::impl::
  group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::
  gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
  ::~gen((gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
          *)local_27d8);
  rangeless::fn::impl::
  seq<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
  ::~seq((seq<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
          *)local_2b88);
  rangeless::fn::impl::maybe<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>::maybe
            ((maybe<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_> *)local_2b88,
             &local_340.m_current);
  rangeless::fn::impl::
  group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::
  gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
  ::gen((gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
         *)&local_2b68,&local_340.m_gen);
  local_2880._2_1_ = local_340.m_resumable;
  local_2880._0_1_ = local_340.m_started;
  local_2880._1_1_ = local_340.m_ended;
  rangeless::fn::impl::
  group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::
  gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
  ::gen((gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
         *)local_27d8,
        (gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
         *)&local_2b68);
  local_24f0 = example::filter_to_unique_cds_for_gene;
  local_1740.m_current.m_empty = true;
  rangeless::fn::impl::
  transform<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_(*)(std::vector<example::aln_t,_std::allocator<example::aln_t>_>)>
  ::
  gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
  ::gen(&local_1740.m_gen,
        (gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
         *)local_27d8);
  local_1740.m_started = false;
  local_1740.m_ended = false;
  local_1740.m_resumable = false;
  rangeless::fn::impl::
  group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::
  gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
  ::~gen((gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
          *)local_27d8);
  rangeless::fn::impl::
  seq<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
  ::~seq((seq<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
          *)local_2b88);
  rangeless::fn::impl::maybe<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>::maybe
            ((maybe<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_> *)local_27d8,
             &local_1740.m_current);
  rangeless::fn::impl::
  transform<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_(*)(std::vector<example::aln_t,_std::allocator<example::aln_t>_>)>
  ::
  gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
  ::gen((gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
         *)&local_27b8[0].m_value,&local_1740.m_gen);
  local_24c6 = local_1740.m_resumable;
  local_24c8 = local_1740.m_started;
  bStack_24c7 = local_1740.m_ended;
  rangeless::fn::impl::
  transform<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_(*)(std::vector<example::aln_t,_std::allocator<example::aln_t>_>)>
  ::
  gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
  ::gen((gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
         *)local_2b88,
        (gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
         *)&local_27b8[0].m_value);
  local_2880._0_1_ = 1;
  local_2880.m_value.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1da8 = 1;
  rangeless::fn::impl::concat::
  gen<rangeless::fn::impl::transform<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_(*)(std::vector<example::aln_t,_std::allocator<example::aln_t>_>)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
  ::gen(&local_1da0,
        (gen<rangeless::fn::impl::transform<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_(*)(std::vector<example::aln_t,_std::allocator<example::aln_t>_>)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
         *)local_2b88);
  local_1a88._0_1_ = false;
  local_1a88._1_1_ = false;
  local_1a86 = 0;
  rangeless::fn::impl::concat::
  gen<rangeless::fn::impl::transform<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_(*)(std::vector<example::aln_t,_std::allocator<example::aln_t>_>)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
  ::~gen((gen<rangeless::fn::impl::transform<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_(*)(std::vector<example::aln_t,_std::allocator<example::aln_t>_>)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
          *)local_2b88);
  rangeless::fn::impl::
  seq<rangeless::fn::impl::transform<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_(*)(std::vector<example::aln_t,_std::allocator<example::aln_t>_>)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
  ::~seq((seq<rangeless::fn::impl::transform<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_(*)(std::vector<example::aln_t,_std::allocator<example::aln_t>_>)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
          *)local_27d8);
  rangeless::fn::impl::
  seq<rangeless::fn::impl::transform<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_(*)(std::vector<example::aln_t,_std::allocator<example::aln_t>_>)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
  ::~seq(&local_1740);
  rangeless::fn::impl::
  seq<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
  ::~seq(&local_340);
  rangeless::fn::impl::
  seq<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
  ::~seq((seq<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
          *)&x);
  rangeless::fn::impl::
  seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
  ::~seq(&local_8b0);
  rangeless::fn::impl::
  seq<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>
  ::~seq(&local_b50);
  rangeless::fn::impl::
  seq<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>
  ::~seq(&local_608);
  rangeless::fn::impl::
  seq<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>
  ::~seq(&local_d88);
  rangeless::fn::impl::
  seq<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>
  ::~seq((seq<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>
          *)local_fb8);
  rangeless::fn::impl::
  seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>
  ::~seq((seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>
          *)local_2098);
  rangeless::fn::impl::
  seq<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>
  ::~seq(&local_2118);
  rangeless::fn::impl::maybe<example::aln_t>::reset(&local_19d8.m_current);
  rangeless::fn::impl::maybe<example::aln_t>::maybe
            ((maybe<example::aln_t> *)local_2b88,(maybe<example::aln_t> *)&local_1e28.m_value);
  rangeless::fn::impl::concat::
  gen<rangeless::fn::impl::transform<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_(*)(std::vector<example::aln_t,_std::allocator<example::aln_t>_>)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
  ::gen((gen<rangeless::fn::impl::transform<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_(*)(std::vector<example::aln_t,_std::allocator<example::aln_t>_>)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
         *)local_2b00,&local_1da0);
  local_27e6 = (bool)local_1a86;
  local_27e8 = local_1a88._0_1_;
  bStack_27e7 = local_1a88._1_1_;
  rangeless::fn::impl::concat::
  gen<rangeless::fn::impl::transform<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_(*)(std::vector<example::aln_t,_std::allocator<example::aln_t>_>)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
  ::operator()(&x,(gen<rangeless::fn::impl::transform<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_(*)(std::vector<example::aln_t,_std::allocator<example::aln_t>_>)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
                   *)local_2b00);
  while (x.m_empty == false) {
    paVar5 = rangeless::fn::impl::maybe<example::aln_t>::operator*(&x);
    example::aln_t::aln_t((aln_t *)&local_1740,paVar5);
    poVar6 = (ostream *)
             std::ostream::operator<<((ostream *)&std::cerr,local_1740.m_current.field_0._8_4_);
    poVar6 = std::operator<<(poVar6,"\t");
    poVar6 = std::ostream::_M_insert<long>((long)poVar6);
    std::operator<<(poVar6,"\n");
    std::vector<long,_std::allocator<long>_>::push_back
              ((vector<long,_std::allocator<long>_> *)&local_2bb8,
               (value_type_conflict1 *)&local_1740);
    example::aln_t::~aln_t((aln_t *)&local_1740);
    rangeless::fn::impl::maybe<example::aln_t>::operator*(&x);
    rangeless::fn::impl::concat::
    gen<rangeless::fn::impl::transform<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_(*)(std::vector<example::aln_t,_std::allocator<example::aln_t>_>)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
    ::operator()((maybe<example::aln_t> *)local_27d8,
                 (gen<rangeless::fn::impl::transform<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_(*)(std::vector<example::aln_t,_std::allocator<example::aln_t>_>)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
                  *)local_2b00);
    rangeless::fn::impl::maybe<example::aln_t>::operator=(&x,(maybe<example::aln_t> *)local_27d8);
    rangeless::fn::impl::maybe<example::aln_t>::reset((maybe<example::aln_t> *)local_27d8);
  }
  rangeless::fn::impl::maybe<example::aln_t>::reset(&x);
  rangeless::fn::impl::
  seq<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_(*)(std::vector<example::aln_t,_std::allocator<example::aln_t>_>)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
  ::~seq((seq<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_(*)(std::vector<example::aln_t,_std::allocator<example::aln_t>_>)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
          *)local_2b88);
  rangeless::fn::impl::
  seq<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_(*)(std::vector<example::aln_t,_std::allocator<example::aln_t>_>)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
  ::~seq((seq<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_(*)(std::vector<example::aln_t,_std::allocator<example::aln_t>_>)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
          *)&local_1e28.m_value);
  rangeless::fn::impl::maybe<example::aln_t>::reset(&local_1a80.m_current);
  local_1e28.m_value.aln_id = 0x1f5;
  local_1e28._8_8_ = 0x65;
  local_1e28.m_value.mrna_id.first._M_dataplus._M_p = (_Alloc_hider)(pointer)0x259;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_1e28;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)local_2b88,__l,(allocator_type *)&x);
  bVar3 = std::operator==((vector<long,_std::allocator<long>_> *)&local_2bb8,
                          (vector<long,_std::allocator<long>_> *)local_2b88);
  if (bVar3) {
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
              ((_Vector_base<long,_std::allocator<long>_> *)local_2b88);
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_2bb8);
    std::vector<example::aln_t,_std::allocator<example::aln_t>_>::~vector(&local_2bd8);
    return 0;
  }
  __assert_fail("(kept_ids == std::vector<int64_t>{{ 501, 101, 601 }} )",
                "/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp"
                ,0x18b,"int main()");
}

Assistant:

int main()
{
    using namespace example;
   
    alns_t alns{}; // normally these would come from a stream, but for the sake of example will yield from a vec.

    // GeneID:2
    alns.push_back(aln_t{ 101, 2, {"NM_000001", 2}, {"NC_000001", 1}, 1000000, 1001000, 100100, 100}); // keep.
    alns.push_back(aln_t{ 102, 2, {"NM_000001", 2}, {"NC_000001", 1}, 1000000, 1001000, 100100, 100}); // duplicate.
    alns.push_back(aln_t{ 103, 2, {"NM_000001", 2}, {"NC_000001", 1}, 1000001, 1001000, 100100, 50 }); // not top-scoring for this mrna.
    alns.push_back(aln_t{ 104, 2, {"NM_000001", 1}, {"NC_000001", 1}, 1000000, 1001000, 100100, 100}); // superceded mrna-version.
    alns.push_back(aln_t{ 201, 2, {"NM_000002", 1}, {"NC_000001", 1}, 1000000, 1001000, 0,      100}); // no valid-CDS.
    alns.push_back(aln_t{ 301, 2, {"NM_000003", 1}, {"NC_000001", 1}, 1000000, 1001000, 0,      100}); // no valid-CDS.
    alns.push_back(aln_t{ 401, 2, {"NM_000004", 1}, {"NC_000001", 1}, 1000000, 1001000, 0,      100}); // no valid-CDS.
    alns.push_back(aln_t{ 501, 2, {"NM_000005", 1}, {"NC_000001", 1}, 1000000, 1001000, 100100, 110}); // keep.
    alns.push_back(aln_t{ 801, 2, {"NM_000008", 1}, {"NC_000001", 1}, 1000000, 1001000, 100200, 100}); // not most-supported-CDS.

    // GeneID:3
    alns.push_back(aln_t{ 601, 3, {"NM_000005", 1}, {"NC_000001", 1}, 1000000, 1001000, 100100, 100});  // keep.
    alns.push_back(aln_t{ 701, 3, {"NM_000007", 1}, {"NT_000001", 1}, 1000000, 1001000, 100100, 100});  // not on NC.
  
    namespace fn = rangeless::fn; 
    using fn::operators::operator%;

    std::vector<int64_t> kept_ids{};

    // we could just std::move(alns) instead of fn::seq(...) here,
    // but demonstrating that input can also be a lazy seq, e.g. deserializing from an istream.
    fn::seq([&, i = 0UL]() mutable -> aln_t
    {
        return i < alns.size() ? std::move(alns[i++]) : fn::end_seq();
    })

  % example::aln_filter

  % fn::for_each( [&](aln_t a)
    {
        std::cerr << a.gene_id << "\t" << a.aln_id << "\n";
        kept_ids.push_back(a.aln_id);
    });

    assert((kept_ids == std::vector<int64_t>{{ 501, 101, 601 }} ));
            
    return 0;
}